

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

void gen_fcc_cond(DisasCompare_conflict *c,DisasContext_conflict2 *s,int cond)

{
  TCGContext_conflict2 *tcg_ctx;
  TCGContext_conflict2 *tcg_ctx_00;
  TCGCond TVar1;
  TCGv_i32 pTVar2;
  TCGTemp *pTVar3;
  TCGv_i32 pTVar4;
  TCGTemp *pTVar5;
  int32_t iVar6;
  uintptr_t o;
  TCGv_i32 arg1;
  
  tcg_ctx = s->uc->tcg_ctx;
  c->g1 = true;
  pTVar2 = tcg_const_i32_m68k(tcg_ctx,0);
  c->v2 = pTVar2;
  c->g2 = false;
  pTVar3 = tcg_temp_new_internal_m68k(tcg_ctx,TCG_TYPE_I32,false);
  arg1 = (TCGv_i32)((long)pTVar3 - (long)tcg_ctx);
  tcg_ctx_00 = s->uc->tcg_ctx;
  tcg_gen_op3_m68k(tcg_ctx_00,INDEX_op_ld_i32,(TCGArg)((long)tcg_ctx_00 + (long)arg1),
                   (TCGArg)(tcg_ctx_00->cpu_env + (long)tcg_ctx_00),0x104);
  pTVar2 = arg1;
  switch(cond) {
  case 0:
  case 0x10:
    c->v1 = c->v2;
    TVar1 = TCG_COND_NEVER;
    goto LAB_007056da;
  case 1:
  case 0x11:
    pTVar3 = tcg_temp_new_internal_m68k(tcg_ctx,TCG_TYPE_I32,false);
    pTVar4 = (TCGv_i32)((long)pTVar3 - (long)tcg_ctx);
    c->v1 = pTVar4;
    c->g1 = false;
    iVar6 = 0x4000000;
    break;
  case 2:
  case 0x12:
    pTVar3 = tcg_temp_new_internal_m68k(tcg_ctx,TCG_TYPE_I32,false);
    pTVar4 = (TCGv_i32)((long)pTVar3 - (long)tcg_ctx);
    c->v1 = pTVar4;
    c->g1 = false;
    goto LAB_0070549f;
  case 3:
  case 0x13:
    pTVar5 = tcg_temp_new_internal_m68k(tcg_ctx,TCG_TYPE_I32,false);
    c->v1 = (TCGv_i32)((long)pTVar5 - (long)tcg_ctx);
    c->g1 = false;
    tcg_gen_andi_i32_m68k(tcg_ctx,(TCGv_i32)((long)pTVar5 - (long)tcg_ctx),arg1,0x1000000);
    tcg_gen_shli_i32_m68k(tcg_ctx,c->v1,c->v1,3);
    iVar6 = 0xc000000;
    goto LAB_00705675;
  case 4:
  case 0x14:
    pTVar3 = tcg_temp_new_internal_m68k(tcg_ctx,TCG_TYPE_I32,false);
    c->v1 = (TCGv_i32)((long)pTVar3 - (long)tcg_ctx);
    c->g1 = false;
    tcg_gen_xori_i32_m68k(tcg_ctx,(TCGv_i32)((long)pTVar3 - (long)tcg_ctx),arg1,0x8000000);
    pTVar4 = c->v1;
    pTVar2 = pTVar4;
LAB_0070549f:
    iVar6 = 0xd000000;
    goto LAB_00705619;
  case 5:
  case 0x15:
    pTVar3 = tcg_temp_new_internal_m68k(tcg_ctx,TCG_TYPE_I32,false);
    c->v1 = (TCGv_i32)((long)pTVar3 - (long)tcg_ctx);
    c->g1 = false;
    tcg_gen_andi_i32_m68k(tcg_ctx,(TCGv_i32)((long)pTVar3 - (long)tcg_ctx),arg1,0x1000000);
    tcg_gen_shli_i32_m68k(tcg_ctx,c->v1,c->v1,3);
    tcg_gen_andc_i32_m68k(tcg_ctx,c->v1,arg1,c->v1);
    pTVar4 = c->v1;
    iVar6 = 0xc000000;
    pTVar2 = pTVar4;
    break;
  case 6:
  case 0x16:
    pTVar3 = tcg_temp_new_internal_m68k(tcg_ctx,TCG_TYPE_I32,false);
    pTVar4 = (TCGv_i32)((long)pTVar3 - (long)tcg_ctx);
    c->v1 = pTVar4;
    c->g1 = false;
    iVar6 = 0x5000000;
    goto LAB_00705619;
  case 7:
  case 0x17:
    pTVar3 = tcg_temp_new_internal_m68k(tcg_ctx,TCG_TYPE_I32,false);
    pTVar4 = (TCGv_i32)((long)pTVar3 - (long)tcg_ctx);
    c->v1 = pTVar4;
    c->g1 = false;
    iVar6 = 0x1000000;
    goto LAB_00705619;
  case 8:
  case 0x18:
    pTVar3 = tcg_temp_new_internal_m68k(tcg_ctx,TCG_TYPE_I32,false);
    pTVar4 = (TCGv_i32)((long)pTVar3 - (long)tcg_ctx);
    c->v1 = pTVar4;
    c->g1 = false;
    iVar6 = 0x1000000;
    break;
  case 9:
  case 0x19:
    pTVar3 = tcg_temp_new_internal_m68k(tcg_ctx,TCG_TYPE_I32,false);
    pTVar4 = (TCGv_i32)((long)pTVar3 - (long)tcg_ctx);
    c->v1 = pTVar4;
    c->g1 = false;
    iVar6 = 0x5000000;
    break;
  case 10:
  case 0x1a:
    pTVar5 = tcg_temp_new_internal_m68k(tcg_ctx,TCG_TYPE_I32,false);
    c->v1 = (TCGv_i32)((long)pTVar5 - (long)tcg_ctx);
    c->g1 = false;
    tcg_gen_andi_i32_m68k(tcg_ctx,(TCGv_i32)((long)pTVar5 - (long)tcg_ctx),arg1,0x4000000);
    tcg_gen_shli_i32_m68k(tcg_ctx,c->v1,c->v1,1);
    iVar6 = 0x9000000;
LAB_00705675:
    tcg_gen_andi_i32_m68k(tcg_ctx,arg1,arg1,iVar6);
    tcg_gen_op3_m68k(tcg_ctx,INDEX_op_or_i32,(TCGArg)(c->v1 + (long)tcg_ctx),
                     (TCGArg)(c->v1 + (long)tcg_ctx),(TCGArg)pTVar3);
LAB_00705694:
    tcg_gen_xori_i32_m68k(tcg_ctx,c->v1,c->v1,0x8000000);
    goto LAB_007056d5;
  case 0xb:
  case 0x1b:
    pTVar3 = tcg_temp_new_internal_m68k(tcg_ctx,TCG_TYPE_I32,false);
    c->v1 = (TCGv_i32)((long)pTVar3 - (long)tcg_ctx);
    c->g1 = false;
    tcg_gen_andi_i32_m68k(tcg_ctx,(TCGv_i32)((long)pTVar3 - (long)tcg_ctx),arg1,0xd000000);
    goto LAB_00705694;
  case 0xc:
  case 0x1c:
    pTVar3 = tcg_temp_new_internal_m68k(tcg_ctx,TCG_TYPE_I32,false);
    c->v1 = (TCGv_i32)((long)pTVar3 - (long)tcg_ctx);
    c->g1 = false;
    tcg_gen_andi_i32_m68k(tcg_ctx,(TCGv_i32)((long)pTVar3 - (long)tcg_ctx),arg1,0x4000000);
    tcg_gen_shli_i32_m68k(tcg_ctx,c->v1,c->v1,1);
    tcg_gen_andc_i32_m68k(tcg_ctx,c->v1,arg1,c->v1);
    pTVar4 = c->v1;
    iVar6 = 0x9000000;
    pTVar2 = pTVar4;
    break;
  case 0xd:
  case 0x1d:
    pTVar3 = tcg_temp_new_internal_m68k(tcg_ctx,TCG_TYPE_I32,false);
    pTVar4 = (TCGv_i32)((long)pTVar3 - (long)tcg_ctx);
    c->v1 = pTVar4;
    c->g1 = false;
    iVar6 = 0xd000000;
    break;
  case 0xe:
  case 0x1e:
    pTVar3 = tcg_temp_new_internal_m68k(tcg_ctx,TCG_TYPE_I32,false);
    pTVar4 = (TCGv_i32)((long)pTVar3 - (long)tcg_ctx);
    c->v1 = pTVar4;
    c->g1 = false;
    iVar6 = 0x4000000;
LAB_00705619:
    tcg_gen_andi_i32_m68k(tcg_ctx,pTVar4,pTVar2,iVar6);
    TVar1 = TCG_COND_EQ;
    goto LAB_007056da;
  case 0xf:
  case 0x1f:
    c->v1 = c->v2;
    TVar1 = TCG_COND_ALWAYS;
    goto LAB_007056da;
  default:
    goto switchD_00705348_default;
  }
  tcg_gen_andi_i32_m68k(tcg_ctx,pTVar4,pTVar2,iVar6);
LAB_007056d5:
  TVar1 = TCG_COND_NE;
LAB_007056da:
  c->tcond = TVar1;
switchD_00705348_default:
  tcg_temp_free_internal_m68k(tcg_ctx,(TCGTemp *)(arg1 + (long)tcg_ctx));
  return;
}

Assistant:

static void gen_fcc_cond(DisasCompare *c, DisasContext *s, int cond)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv fpsr;

    c->g1 = 1;
    c->v2 = tcg_const_i32(tcg_ctx, 0);
    c->g2 = 0;
    /* TODO: Raise BSUN exception.  */
    fpsr = tcg_temp_new(tcg_ctx);
    gen_load_fcr(s, fpsr, M68K_FPSR);
    switch (cond) {
    case 0:  /* False */
    case 16: /* Signaling False */
        c->v1 = c->v2;
        c->tcond = TCG_COND_NEVER;
        break;
    case 1:  /* EQual Z */
    case 17: /* Signaling EQual Z */
        c->v1 = tcg_temp_new(tcg_ctx);
        c->g1 = 0;
        tcg_gen_andi_i32(tcg_ctx, c->v1, fpsr, FPSR_CC_Z);
        c->tcond = TCG_COND_NE;
        break;
    case 2:  /* Ordered Greater Than !(A || Z || N) */
    case 18: /* Greater Than !(A || Z || N) */
        c->v1 = tcg_temp_new(tcg_ctx);
        c->g1 = 0;
        tcg_gen_andi_i32(tcg_ctx, c->v1, fpsr,
                         FPSR_CC_A | FPSR_CC_Z | FPSR_CC_N);
        c->tcond = TCG_COND_EQ;
        break;
    case 3:  /* Ordered Greater than or Equal Z || !(A || N) */
    case 19: /* Greater than or Equal Z || !(A || N) */
        c->v1 = tcg_temp_new(tcg_ctx);
        c->g1 = 0;
        tcg_gen_andi_i32(tcg_ctx, c->v1, fpsr, FPSR_CC_A);
        tcg_gen_shli_i32(tcg_ctx, c->v1, c->v1, ctz32(FPSR_CC_N) - ctz32(FPSR_CC_A));
        tcg_gen_andi_i32(tcg_ctx, fpsr, fpsr, FPSR_CC_Z | FPSR_CC_N);
        tcg_gen_or_i32(tcg_ctx, c->v1, c->v1, fpsr);
        tcg_gen_xori_i32(tcg_ctx, c->v1, c->v1, FPSR_CC_N);
        c->tcond = TCG_COND_NE;
        break;
    case 4:  /* Ordered Less Than !(!N || A || Z); */
    case 20: /* Less Than !(!N || A || Z); */
        c->v1 = tcg_temp_new(tcg_ctx);
        c->g1 = 0;
        tcg_gen_xori_i32(tcg_ctx, c->v1, fpsr, FPSR_CC_N);
        tcg_gen_andi_i32(tcg_ctx, c->v1, c->v1, FPSR_CC_N | FPSR_CC_A | FPSR_CC_Z);
        c->tcond = TCG_COND_EQ;
        break;
    case 5:  /* Ordered Less than or Equal Z || (N && !A) */
    case 21: /* Less than or Equal Z || (N && !A) */
        c->v1 = tcg_temp_new(tcg_ctx);
        c->g1 = 0;
        tcg_gen_andi_i32(tcg_ctx, c->v1, fpsr, FPSR_CC_A);
        tcg_gen_shli_i32(tcg_ctx, c->v1, c->v1, ctz32(FPSR_CC_N) - ctz32(FPSR_CC_A));
        tcg_gen_andc_i32(tcg_ctx, c->v1, fpsr, c->v1);
        tcg_gen_andi_i32(tcg_ctx, c->v1, c->v1, FPSR_CC_Z | FPSR_CC_N);
        c->tcond = TCG_COND_NE;
        break;
    case 6:  /* Ordered Greater or Less than !(A || Z) */
    case 22: /* Greater or Less than !(A || Z) */
        c->v1 = tcg_temp_new(tcg_ctx);
        c->g1 = 0;
        tcg_gen_andi_i32(tcg_ctx, c->v1, fpsr, FPSR_CC_A | FPSR_CC_Z);
        c->tcond = TCG_COND_EQ;
        break;
    case 7:  /* Ordered !A */
    case 23: /* Greater, Less or Equal !A */
        c->v1 = tcg_temp_new(tcg_ctx);
        c->g1 = 0;
        tcg_gen_andi_i32(tcg_ctx, c->v1, fpsr, FPSR_CC_A);
        c->tcond = TCG_COND_EQ;
        break;
    case 8:  /* Unordered A */
    case 24: /* Not Greater, Less or Equal A */
        c->v1 = tcg_temp_new(tcg_ctx);
        c->g1 = 0;
        tcg_gen_andi_i32(tcg_ctx, c->v1, fpsr, FPSR_CC_A);
        c->tcond = TCG_COND_NE;
        break;
    case 9:  /* Unordered or Equal A || Z */
    case 25: /* Not Greater or Less then A || Z */
        c->v1 = tcg_temp_new(tcg_ctx);
        c->g1 = 0;
        tcg_gen_andi_i32(tcg_ctx, c->v1, fpsr, FPSR_CC_A | FPSR_CC_Z);
        c->tcond = TCG_COND_NE;
        break;
    case 10: /* Unordered or Greater Than A || !(N || Z)) */
    case 26: /* Not Less or Equal A || !(N || Z)) */
        c->v1 = tcg_temp_new(tcg_ctx);
        c->g1 = 0;
        tcg_gen_andi_i32(tcg_ctx, c->v1, fpsr, FPSR_CC_Z);
        tcg_gen_shli_i32(tcg_ctx, c->v1, c->v1, ctz32(FPSR_CC_N) - ctz32(FPSR_CC_Z));
        tcg_gen_andi_i32(tcg_ctx, fpsr, fpsr, FPSR_CC_A | FPSR_CC_N);
        tcg_gen_or_i32(tcg_ctx, c->v1, c->v1, fpsr);
        tcg_gen_xori_i32(tcg_ctx, c->v1, c->v1, FPSR_CC_N);
        c->tcond = TCG_COND_NE;
        break;
    case 11: /* Unordered or Greater or Equal A || Z || !N */
    case 27: /* Not Less Than A || Z || !N */
        c->v1 = tcg_temp_new(tcg_ctx);
        c->g1 = 0;
        tcg_gen_andi_i32(tcg_ctx, c->v1, fpsr, FPSR_CC_A | FPSR_CC_Z | FPSR_CC_N);
        tcg_gen_xori_i32(tcg_ctx, c->v1, c->v1, FPSR_CC_N);
        c->tcond = TCG_COND_NE;
        break;
    case 12: /* Unordered or Less Than A || (N && !Z) */
    case 28: /* Not Greater than or Equal A || (N && !Z) */
        c->v1 = tcg_temp_new(tcg_ctx);
        c->g1 = 0;
        tcg_gen_andi_i32(tcg_ctx, c->v1, fpsr, FPSR_CC_Z);
        tcg_gen_shli_i32(tcg_ctx, c->v1, c->v1, ctz32(FPSR_CC_N) - ctz32(FPSR_CC_Z));
        tcg_gen_andc_i32(tcg_ctx, c->v1, fpsr, c->v1);
        tcg_gen_andi_i32(tcg_ctx, c->v1, c->v1, FPSR_CC_A | FPSR_CC_N);
        c->tcond = TCG_COND_NE;
        break;
    case 13: /* Unordered or Less or Equal A || Z || N */
    case 29: /* Not Greater Than A || Z || N */
        c->v1 = tcg_temp_new(tcg_ctx);
        c->g1 = 0;
        tcg_gen_andi_i32(tcg_ctx, c->v1, fpsr, FPSR_CC_A | FPSR_CC_Z | FPSR_CC_N);
        c->tcond = TCG_COND_NE;
        break;
    case 14: /* Not Equal !Z */
    case 30: /* Signaling Not Equal !Z */
        c->v1 = tcg_temp_new(tcg_ctx);
        c->g1 = 0;
        tcg_gen_andi_i32(tcg_ctx, c->v1, fpsr, FPSR_CC_Z);
        c->tcond = TCG_COND_EQ;
        break;
    case 15: /* True */
    case 31: /* Signaling True */
        c->v1 = c->v2;
        c->tcond = TCG_COND_ALWAYS;
        break;
    }
    tcg_temp_free(tcg_ctx, fpsr);
}